

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::desaturate<unsigned_char>(image *this,ConstPtr *img,DesaturateType type)

{
  int iVar1;
  element_type *peVar2;
  code *pcVar3;
  undefined1 uVar4;
  invalid_argument *piVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint chans;
  Ptr PVar11;
  ulong uVar10;
  
  peVar2 = (img->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Null image given");
  }
  else {
    iVar1 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
    if (0xfffffffd < iVar1 - 5U) {
      Image<unsigned_char>::create();
      peVar2 = (img->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      chans = (iVar1 == 4) + 1;
      TypedImageBase<unsigned_char>::allocate
                (*(TypedImageBase<unsigned_char> **)this,
                 (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w,
                 (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h,chans);
      if (type < (DESATURATE_AVERAGE|DESATURATE_LIGHTNESS)) {
        pcVar3 = (code *)(&PTR_desaturate_maximum<unsigned_char>_00129e80)[type];
        peVar2 = (img->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        uVar8 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h *
                (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
        uVar7 = 0;
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = uVar7;
        }
        uVar8 = 0;
        _Var6._M_pi = extraout_RDX;
        while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
          uVar4 = (*pcVar3)((((img->
                              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->super_TypedImageBase<unsigned_char>).data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar8);
          *(undefined1 *)(*(long *)(*(long *)this + 0x18) + uVar7) = uVar4;
          iVar9 = 3;
          if (iVar1 == 4) {
            *(uchar *)(*(long *)(*(long *)this + 0x18) + 1 + uVar7) =
                 (((img->
                   super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_TypedImageBase<unsigned_char>).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[(ulong)uVar8 + 3];
            iVar9 = 4;
          }
          uVar7 = uVar7 + chans;
          uVar8 = uVar8 + iVar9;
          _Var6._M_pi = extraout_RDX_00;
        }
        PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var6._M_pi;
        PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (Ptr)PVar11.
                    super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
      }
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Invalid desaturate type");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Image must be RGB or RGBA");
  }
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
desaturate (typename Image<T>::ConstPtr img, DesaturateType type)
{
    if (img == nullptr)
        throw std::invalid_argument("Null image given");

    int ic = img->channels();
    if (ic != 3 && ic != 4)
        throw std::invalid_argument("Image must be RGB or RGBA");

    bool has_alpha = (ic == 4);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(img->width(), img->height(), 1 + has_alpha);

    typedef T(*DesaturateFunc)(T const*);
    DesaturateFunc func;
    switch (type)
    {
        case DESATURATE_MAXIMUM: func = desaturate_maximum<T>; break;
        case DESATURATE_LIGHTNESS: func = desaturate_lightness<T>; break;
        case DESATURATE_LUMINOSITY: func = desaturate_luminosity<T>; break;
        case DESATURATE_LUMINANCE: func = desaturate_luminance<T>; break;
        case DESATURATE_AVERAGE: func = desaturate_average<T>; break;
        default: throw std::invalid_argument("Invalid desaturate type");
    }

    int outpos = 0;
    int inpos = 0;
    int pixels = img->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        T const* v = &img->at(inpos);
        out->at(outpos) = func(v);

        if (has_alpha)
            out->at(outpos + 1) = img->at(inpos + 3);

        outpos += 1 + has_alpha;
        inpos += 3 + has_alpha;
    }

    return out;
}